

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vulkan.c
# Opt level: O0

char ** glfwGetRequiredInstanceExtensions(uint32_t *count)

{
  GLFWbool GVar1;
  uint32_t *count_local;
  
  *count = 0;
  if (_glfwInitialized == 0) {
    _glfwInputError(0x10001,(char *)0x0);
    count_local = (uint32_t *)0x0;
  }
  else {
    GVar1 = _glfwInitVulkan();
    if (GVar1 == 0) {
      _glfwInputError(0x10006,"Vulkan: API not available");
      count_local = (uint32_t *)0x0;
    }
    else {
      *count = _glfw.vk.extensionCount;
      count_local = (uint32_t *)_glfw.vk.extensions;
    }
  }
  return (char **)count_local;
}

Assistant:

GLFWAPI const char** glfwGetRequiredInstanceExtensions(uint32_t* count)
{
    *count = 0;

    _GLFW_REQUIRE_INIT_OR_RETURN(NULL);

    if (!_glfwInitVulkan())
    {
        _glfwInputError(GLFW_API_UNAVAILABLE, "Vulkan: API not available");
        return NULL;
    }

    *count = _glfw.vk.extensionCount;
    return (const char**) _glfw.vk.extensions;
}